

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3Float.h
# Opt level: O3

void __thiscall
DIS::CollisionElasticPdu::setUnitSurfaceNormal(CollisionElasticPdu *this,Vector3Float *pX)

{
  float fVar1;
  
  (this->_unitSurfaceNormal)._z = pX->_z;
  fVar1 = pX->_y;
  (this->_unitSurfaceNormal)._x = pX->_x;
  (this->_unitSurfaceNormal)._y = fVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT Vector3Float
{
protected:
  /** X value */
  float _x; 

  /** y Value */
  float _y; 

  /** Z value */
  float _z; 


 public:
    Vector3Float();
    virtual ~Vector3Float();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getX() const; 
    void setX(float pX); 

    float getY() const; 
    void setY(float pX); 

    float getZ() const; 
    void setZ(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Vector3Float& rhs) const;
}